

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O3

AggregateFunction *
duckdb::GetReservoirQuantileAggregateFunction
          (AggregateFunction *__return_storage_ptr__,PhysicalType type)

{
  int iVar1;
  InternalException *this;
  LogicalType *in_RCX;
  uint *return_type;
  undefined7 in_register_00000031;
  AggregateFunction *this_00;
  LogicalType *this_01;
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  LogicalType local_170 [24];
  undefined1 local_158 [48];
  undefined1 local_128 [48];
  undefined1 local_f8 [48];
  undefined1 local_c8 [48];
  undefined1 local_98 [48];
  undefined1 local_68 [48];
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  return_type = &switchD_004bd3a4::switchdataD_00774d70;
  switch(iVar1) {
  case 3:
    this_00 = (AggregateFunction *)&stack0xffffffffffffffc8;
    duckdb::LogicalType::LogicalType((LogicalType *)this_00,TINYINT);
    this_01 = (LogicalType *)(local_68 + 0x18);
    duckdb::LogicalType::LogicalType(this_01,TINYINT);
    AggregateFunction::
    UnaryAggregateDestructor<duckdb::ReservoirQuantileState<signed_char>,signed_char,signed_char,duckdb::ReservoirQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,this_00,this_01,(LogicalType *)return_type);
    break;
  case 4:
  case 6:
  case 8:
  case 10:
switchD_004bd3a4_caseD_4:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_190[0] = local_180;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_190,"Unimplemented reservoir quantile aggregate","");
    duckdb::InternalException::InternalException(this,(string *)local_190);
    __cxa_throw(this,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  case 5:
    this_00 = (AggregateFunction *)local_68;
    duckdb::LogicalType::LogicalType((LogicalType *)this_00,SMALLINT);
    this_01 = (LogicalType *)(local_98 + 0x18);
    duckdb::LogicalType::LogicalType(this_01,SMALLINT);
    AggregateFunction::
    UnaryAggregateDestructor<duckdb::ReservoirQuantileState<short>,short,short,duckdb::ReservoirQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,this_00,this_01,(LogicalType *)return_type);
    break;
  case 7:
    this_00 = (AggregateFunction *)local_98;
    duckdb::LogicalType::LogicalType((LogicalType *)this_00,INTEGER);
    this_01 = (LogicalType *)(local_c8 + 0x18);
    duckdb::LogicalType::LogicalType(this_01,INTEGER);
    AggregateFunction::
    UnaryAggregateDestructor<duckdb::ReservoirQuantileState<int>,int,int,duckdb::ReservoirQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,this_00,this_01,(LogicalType *)return_type);
    break;
  case 9:
    this_00 = (AggregateFunction *)local_c8;
    duckdb::LogicalType::LogicalType((LogicalType *)this_00,BIGINT);
    this_01 = (LogicalType *)(local_f8 + 0x18);
    duckdb::LogicalType::LogicalType(this_01,BIGINT);
    AggregateFunction::
    UnaryAggregateDestructor<duckdb::ReservoirQuantileState<long>,long,long,duckdb::ReservoirQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,this_00,this_01,(LogicalType *)return_type);
    break;
  case 0xb:
    this_00 = (AggregateFunction *)local_128;
    duckdb::LogicalType::LogicalType((LogicalType *)this_00,FLOAT);
    this_01 = (LogicalType *)(local_158 + 0x18);
    duckdb::LogicalType::LogicalType(this_01,FLOAT);
    AggregateFunction::
    UnaryAggregateDestructor<duckdb::ReservoirQuantileState<float>,float,float,duckdb::ReservoirQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,this_00,this_01,(LogicalType *)return_type);
    break;
  case 0xc:
    this_00 = (AggregateFunction *)local_158;
    duckdb::LogicalType::LogicalType((LogicalType *)this_00,DOUBLE);
    this_01 = local_170;
    duckdb::LogicalType::LogicalType(this_01,DOUBLE);
    AggregateFunction::
    UnaryAggregateDestructor<duckdb::ReservoirQuantileState<double>,double,double,duckdb::ReservoirQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,this_00,this_01,(LogicalType *)return_type);
    break;
  default:
    if (iVar1 != 0xcc) goto switchD_004bd3a4_caseD_4;
    this_00 = (AggregateFunction *)local_f8;
    duckdb::LogicalType::LogicalType((LogicalType *)this_00,HUGEINT);
    this_01 = (LogicalType *)(local_128 + 0x18);
    duckdb::LogicalType::LogicalType(this_01,HUGEINT);
    AggregateFunction::
    UnaryAggregateDestructor<duckdb::ReservoirQuantileState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::ReservoirQuantileScalarOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,this_00,this_01,in_RCX);
  }
  duckdb::LogicalType::~LogicalType(this_01);
  duckdb::LogicalType::~LogicalType((LogicalType *)this_00);
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetReservoirQuantileAggregateFunction(PhysicalType type) {
	switch (type) {
	case PhysicalType::INT8:
		return AggregateFunction::UnaryAggregateDestructor<ReservoirQuantileState<int8_t>, int8_t, int8_t,
		                                                   ReservoirQuantileScalarOperation>(LogicalType::TINYINT,
		                                                                                     LogicalType::TINYINT);

	case PhysicalType::INT16:
		return AggregateFunction::UnaryAggregateDestructor<ReservoirQuantileState<int16_t>, int16_t, int16_t,
		                                                   ReservoirQuantileScalarOperation>(LogicalType::SMALLINT,
		                                                                                     LogicalType::SMALLINT);

	case PhysicalType::INT32:
		return AggregateFunction::UnaryAggregateDestructor<ReservoirQuantileState<int32_t>, int32_t, int32_t,
		                                                   ReservoirQuantileScalarOperation>(LogicalType::INTEGER,
		                                                                                     LogicalType::INTEGER);

	case PhysicalType::INT64:
		return AggregateFunction::UnaryAggregateDestructor<ReservoirQuantileState<int64_t>, int64_t, int64_t,
		                                                   ReservoirQuantileScalarOperation>(LogicalType::BIGINT,
		                                                                                     LogicalType::BIGINT);

	case PhysicalType::INT128:
		return AggregateFunction::UnaryAggregateDestructor<ReservoirQuantileState<hugeint_t>, hugeint_t, hugeint_t,
		                                                   ReservoirQuantileScalarOperation>(LogicalType::HUGEINT,
		                                                                                     LogicalType::HUGEINT);
	case PhysicalType::FLOAT:
		return AggregateFunction::UnaryAggregateDestructor<ReservoirQuantileState<float>, float, float,
		                                                   ReservoirQuantileScalarOperation>(LogicalType::FLOAT,
		                                                                                     LogicalType::FLOAT);
	case PhysicalType::DOUBLE:
		return AggregateFunction::UnaryAggregateDestructor<ReservoirQuantileState<double>, double, double,
		                                                   ReservoirQuantileScalarOperation>(LogicalType::DOUBLE,
		                                                                                     LogicalType::DOUBLE);
	default:
		throw InternalException("Unimplemented reservoir quantile aggregate");
	}
}